

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sentinel.cpp
# Opt level: O0

int AF_A_SentinelRefire(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  int iVar1;
  AActor *pAVar2;
  bool bVar3;
  bool local_4e;
  bool local_4b;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_sentinel.cpp"
                  ,0x4e,"int AF_A_SentinelRefire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_sentinel.cpp"
                  ,0x4e,"int AF_A_SentinelRefire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  self_00 = *(AActor **)&param->field_0;
  local_4b = true;
  if (self_00 != (AActor *)0x0) {
    local_4b = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
  }
  if (local_4b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_sentinel.cpp"
                  ,0x4e,"int AF_A_SentinelRefire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
      bVar3 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_sentinel.cpp"
                    ,0x4e,"int AF_A_SentinelRefire(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    this = (DObject *)param[1].field_0.field_1.a;
    local_4e = true;
    if (this != (DObject *)0x0) {
      local_4e = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_4e == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_sentinel.cpp"
                    ,0x4e,"int AF_A_SentinelRefire(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[2].field_0.field_1.atag != 8)) {
      bVar3 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_sentinel.cpp"
                    ,0x4e,"int AF_A_SentinelRefire(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  A_FaceTarget(self_00);
  iVar1 = FRandom::operator()(&pr_sentinelrefire);
  if (0x1d < iVar1) {
    bVar3 = TObjPtr<AActor>::operator==(&self_00->target,(AActor *)0x0);
    if ((!bVar3) && (pAVar2 = TObjPtr<AActor>::operator->(&self_00->target), 0 < pAVar2->health)) {
      pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->target);
      bVar3 = P_CheckSight(self_00,pAVar2,6);
      if (((bVar3) && (bVar3 = P_HitFriend(self_00), !bVar3)) &&
         (((self_00->MissileState != (FState *)0x0 ||
           (bVar3 = AActor::CheckMeleeRange(self_00), bVar3)) &&
          (iVar1 = FRandom::operator()(&pr_sentinelrefire), 0x27 < iVar1)))) {
        return 0;
      }
    }
    AActor::SetState(self_00,self_00->SeeState,false);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SentinelRefire)
{
	PARAM_ACTION_PROLOGUE;

	A_FaceTarget (self);

	if (pr_sentinelrefire() >= 30)
	{
		if (self->target == NULL ||
			self->target->health <= 0 ||
			!P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING|SF_SEEPASTSHOOTABLELINES) ||
			P_HitFriend(self) ||
			(self->MissileState == NULL && !self->CheckMeleeRange()) ||
			pr_sentinelrefire() < 40)
		{
			self->SetState (self->SeeState);
		}
	}
	return 0;
}